

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void __thiscall JsonArray_TooDeeplyNested_Test::TestBody(JsonArray_TooDeeplyNested_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  error_category *peVar2;
  parser<json_out_callbacks> *this_00;
  char *message;
  AssertHelper AStack_148;
  error_category *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  long local_130 [2];
  long *local_120;
  error_category *local_118;
  json_out_callbacks local_110;
  result_type local_f0;
  parser<json_out_callbacks> local_d0;
  
  paVar1 = &local_110.out_.field_2;
  local_110.out_.field_2._M_allocated_capacity = 0;
  local_110.out_.field_2._8_8_ = 0;
  local_110.out_._M_string_length = 0;
  local_110.out_._M_dataplus._M_p = (pointer)paVar1;
  pstore::json::parser<json_out_callbacks>::parser(&local_d0,&local_110,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.out_._M_dataplus._M_p,local_110.out_.field_2._M_allocated_capacity + 1
                   );
  }
  local_140 = (error_category *)local_130;
  std::__cxx11::string::_M_construct((ulong)&local_140,-0x38);
  peVar2 = local_140;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_120,(index_type)local_138);
  local_118 = peVar2;
  this_00 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                      (&local_d0,(span<const_char,__1L> *)&local_120);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_f0,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != (error_category *)local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  local_118 = pstore::json::get_error_category();
  local_120 = (long *)CONCAT44(local_120._4_4_,0xe);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_140,"p.last_error ()",
             "make_error_code (json::error_code::nesting_too_deep)",&local_d0.error_,
             (error_code *)&local_120);
  if (local_140._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_138 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_138->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xff,message);
    testing::internal::AssertHelper::operator=(&AStack_148,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_148);
    if (local_120 != (long *)0x0) {
      (**(code **)(*local_120 + 8))();
    }
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.string_._M_dataplus._M_p != &local_d0.string_.field_2) {
    operator_delete(local_d0.string_._M_dataplus._M_p,
                    local_d0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.callbacks_.out_._M_dataplus._M_p != &local_d0.callbacks_.out_.field_2) {
    operator_delete(local_d0.callbacks_.out_._M_dataplus._M_p,
                    local_d0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_d0.stack_.c);
  if (local_d0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_d0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, TooDeeplyNested) {
    json::parser<json_out_callbacks> p;
    p.input (std::string (std::string::size_type{200}, '[')).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::nesting_too_deep));
}